

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::DeepScanLineOutputFile::setFrameBuffer
          (DeepScanLineOutputFile *this,DeepFrameBuffer *frameBuffer)

{
  _Base_ptr name;
  int iVar1;
  pthread_mutex_t *__mutex;
  Data *pDVar2;
  undefined8 uVar3;
  pointer ppOVar4;
  _Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
  *this_00;
  ptrdiff_t pVar5;
  pointer ppOVar6;
  ChannelList *this_01;
  const_iterator cVar7;
  ConstIterator CVar8;
  ConstIterator CVar9;
  const_iterator cVar10;
  Slice *pSVar11;
  pointer ppOVar12;
  ostream *poVar13;
  char *pcVar14;
  ArgExc *pAVar15;
  size_t __n;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar16;
  size_t i;
  ulong uVar17;
  pointer ppOVar18;
  ulong __n_00;
  value_type local_1c0;
  vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
  slices;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  std::mutex::lock((mutex *)&__mutex->__data);
  this_01 = Header::channels(&this->_data->header);
  for (cVar7._M_node = (_Base_ptr)ChannelList::begin(this_01); CVar8 = ChannelList::end(this_01),
      (const_iterator)cVar7._M_node != CVar8._i._M_node;
      cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node)) {
    name = cVar7._M_node + 1;
    CVar9 = DeepFrameBuffer::find(frameBuffer,(char *)name);
    cVar10._M_node = (_Base_ptr)DeepFrameBuffer::end(frameBuffer);
    if (CVar9._i._M_node != (const_iterator)cVar10._M_node) {
      if (cVar7._M_node[9]._M_color != *(_Rb_tree_color *)((long)CVar9._i._M_node + 0x120)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&slices);
        poVar13 = std::operator<<((ostream *)
                                  &slices.
                                   super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  "Pixel type of \"");
        poVar13 = std::operator<<(poVar13,(char *)name);
        poVar13 = std::operator<<(poVar13,"\" channel of output file \"");
        pcVar14 = fileName(this);
        poVar13 = std::operator<<(poVar13,pcVar14);
        std::operator<<(poVar13,"\" is not compatible with the frame buffer\'s pixel type.");
        pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar15,(stringstream *)&slices);
        __cxa_throw(pAVar15,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      if ((*(int *)&cVar7._M_node[9].field_0x4 != *(int *)((long)CVar9._i._M_node + 0x140)) ||
         (*(int *)&cVar7._M_node[9]._M_parent != *(int *)((long)CVar9._i._M_node + 0x144))) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&slices);
        poVar13 = std::operator<<((ostream *)
                                  &slices.
                                   super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  "X and/or y subsampling factors of \"");
        poVar13 = std::operator<<(poVar13,(char *)name);
        poVar13 = std::operator<<(poVar13,"\" channel of output file \"");
        pcVar14 = fileName(this);
        poVar13 = std::operator<<(poVar13,pcVar14);
        std::operator<<(poVar13,
                        "\" are not compatible with the frame buffer\'s subsampling factors.");
        pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar15,(stringstream *)&slices);
        __cxa_throw(pAVar15,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
    }
  }
  pSVar11 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
  if (pSVar11->base == (char *)0x0) {
    pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar15,"Invalid base pointer, please set a proper sample count slice.")
    ;
    __cxa_throw(pAVar15,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  pDVar2 = this->_data;
  pDVar2->sampleCountSliceBase = pSVar11->base;
  sVar16 = pSVar11->yStride;
  pDVar2->sampleCountXStride = (int)pSVar11->xStride;
  pDVar2->sampleCountYStride = (int)sVar16;
  slices.
  super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  slices.
  super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  slices.
  super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar7._M_node = (_Base_ptr)ChannelList::begin(this_01);
  for (; CVar8 = ChannelList::end(this_01), (const_iterator)cVar7._M_node != CVar8._i._M_node;
      cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node)) {
    CVar9 = DeepFrameBuffer::find(frameBuffer,(char *)(cVar7._M_node + 1));
    cVar10._M_node = (_Base_ptr)DeepFrameBuffer::end(frameBuffer);
    if (CVar9._i._M_node == (const_iterator)cVar10._M_node) {
      local_1c0 = (value_type)operator_new(0x38);
      local_1c0->type = cVar7._M_node[9]._M_color;
      uVar3 = *(undefined8 *)&cVar7._M_node[9].field_0x4;
      local_1c0->xStride = 0;
      local_1c0->yStride = 0;
      local_1c0->base = (char *)0x0;
      local_1c0->sampleStride = 0;
      local_1c0->xSampling = (int)uVar3;
      local_1c0->ySampling = (int)((ulong)uVar3 >> 0x20);
      local_1c0->zero = true;
      std::
      vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
      ::push_back(&slices,&local_1c0);
    }
    else {
      local_1c0 = (value_type)operator_new(0x38);
      pcVar14 = *(char **)((long)CVar9._i._M_node + 0x128);
      iVar1 = *(int *)((long)CVar9._i._M_node + 0x154);
      local_1c0->type = *(PixelType *)((long)CVar9._i._M_node + 0x120);
      local_1c0->base = pcVar14;
      local_1c0->sampleStride = (long)iVar1;
      pVar5 = *(ptrdiff_t *)((long)CVar9._i._M_node + 0x138);
      local_1c0->xStride = *(ptrdiff_t *)((long)CVar9._i._M_node + 0x130);
      local_1c0->yStride = pVar5;
      uVar3 = *(undefined8 *)((long)CVar9._i._M_node + 0x140);
      local_1c0->xSampling = (int)uVar3;
      local_1c0->ySampling = (int)((ulong)uVar3 >> 0x20);
      local_1c0->zero = false;
      std::
      vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
      ::push_back(&slices,&local_1c0);
    }
  }
  DeepFrameBuffer::operator=(&this->_data->frameBuffer,frameBuffer);
  uVar17 = 0;
  while( true ) {
    pDVar2 = this->_data;
    ppOVar12 = (pDVar2->slices).
               super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppOVar4 = (pDVar2->slices).
              super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __n = (long)ppOVar4 - (long)ppOVar12;
    if ((ulong)((long)__n >> 3) <= uVar17) break;
    frameBuffer = (DeepFrameBuffer *)&DAT_00000038;
    operator_delete(ppOVar12[uVar17],0x38);
    uVar17 = uVar17 + 1;
  }
  ppOVar18 = slices.
             super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppOVar6 = slices.
            super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar17 = (long)slices.
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)slices.
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(pDVar2->slices).
                    super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppOVar12) < uVar17) {
    ppOVar12 = std::
               _Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
               ::_M_allocate((_Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                              *)((long)uVar17 >> 3),(size_t)frameBuffer);
    sVar16 = extraout_RDX;
    if (ppOVar6 != ppOVar18) {
      memcpy(ppOVar12,ppOVar18,uVar17);
      sVar16 = extraout_RDX_00;
    }
    this_00 = (_Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
               *)(pDVar2->slices).
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    std::
    _Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
    ::_M_deallocate(this_00,(pointer)((long)(pDVar2->slices).
                                            super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)this_00 >> 3),sVar16);
    (pDVar2->slices).
    super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppOVar12;
    (pDVar2->slices).
    super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)ppOVar12 + uVar17);
  }
  else {
    if (__n < uVar17) {
      if (ppOVar4 != ppOVar12) {
        memmove(ppOVar12,slices.
                         super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,__n);
        ppOVar4 = (pDVar2->slices).
                  super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __n = (long)ppOVar4 -
              (long)(pDVar2->slices).
                    super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      }
      ppOVar12 = ppOVar4;
      ppOVar18 = (pointer)((long)ppOVar18 + __n);
      __n_00 = (long)ppOVar6 - (long)ppOVar18;
      if (__n_00 == 0) goto LAB_001676b0;
    }
    else {
      __n_00 = uVar17;
      if (slices.
          super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          slices.
          super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_start) goto LAB_001676b0;
    }
    memmove(ppOVar12,ppOVar18,__n_00);
  }
LAB_001676b0:
  (pDVar2->slices).
  super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(uVar17 + (long)(pDVar2->slices).
                                super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
  ::~vector(&slices);
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
DeepScanLineOutputFile::setFrameBuffer (const DeepFrameBuffer& frameBuffer)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList& channels = _data->header.channels ();

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ()) continue;

        if (i.channel ().type != j.slice ().type)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Pixel type of \"" << i.name ()
                                   << "\" channel "
                                      "of output file \""
                                   << fileName ()
                                   << "\" is "
                                      "not compatible with the frame buffer's "
                                      "pixel type.");
        }

        if (i.channel ().xSampling != j.slice ().xSampling ||
            i.channel ().ySampling != j.slice ().ySampling)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "X and/or y subsampling factors "
                "of \""
                    << i.name ()
                    << "\" channel "
                       "of output file \""
                    << fileName ()
                    << "\" are "
                       "not compatible with the frame buffer's "
                       "subsampling factors.");
        }
    }

    //
    // Store the pixel sample count table.
    // (TODO) Support for different sampling rates?
    //

    const Slice& sampleCountSlice = frameBuffer.getSampleCountSlice ();
    if (sampleCountSlice.base == 0)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Invalid base pointer, please set a proper sample count slice.");
    }
    else
    {
        _data->sampleCountSliceBase = sampleCountSlice.base;
        _data->sampleCountXStride = static_cast<int> (sampleCountSlice.xStride);
        _data->sampleCountYStride = static_cast<int> (sampleCountSlice.yStride);
    }

    //
    // Initialize slice table for writePixels().
    // Pixel sample count slice is not presented in the header,
    // so it wouldn't be added here.
    // Store the pixel base pointer table.
    // (TODO) Support for different sampling rates?
    //

    vector<OutSliceInfo*> slices;

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ())
        {
            //
            // Channel i is not present in the frame buffer.
            // In the file, channel i will contain only zeroes.
            //

            slices.push_back (new OutSliceInfo (
                i.channel ().type,
                NULL, // base
                0,    // sampleStride,
                0,    // xStride
                0,    // yStride
                i.channel ().xSampling,
                i.channel ().ySampling,
                true)); // zero
        }
        else
        {
            //
            // Channel i is present in the frame buffer.
            //

            slices.push_back (new OutSliceInfo (
                j.slice ().type,
                j.slice ().base,
                j.slice ().sampleStride,
                j.slice ().xStride,
                j.slice ().yStride,
                j.slice ().xSampling,
                j.slice ().ySampling,
                false)); // zero
        }
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;

    for (size_t i = 0; i < _data->slices.size (); i++)
        delete _data->slices[i];
    _data->slices = slices;
}